

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIRType * __thiscall spirv_cross::Compiler::get_type_from_variable(Compiler *this,VariableID id)

{
  uint32_t uVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  Compiler *this_local;
  VariableID id_local;
  
  this_local._4_4_ = id.id;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar2 = get<spirv_cross::SPIRVariable>(this,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).field_0xc);
  pSVar3 = get<spirv_cross::SPIRType>(this,uVar1);
  return pSVar3;
}

Assistant:

const SPIRType &Compiler::get_type_from_variable(VariableID id) const
{
	return get<SPIRType>(get<SPIRVariable>(id).basetype);
}